

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dim.cc
# Opt level: O3

ostream * cnn::operator<<(ostream *os,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *ds)

{
  ulong uVar1;
  ostream *poVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
  if ((ds->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (ds->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar3 = 1;
    uVar5 = 0;
    do {
      pcVar4 = "";
      if (uVar3 != 1) {
        pcVar4 = " ";
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,(ulong)(uVar3 != 1));
      operator<<(os,(ds->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                    super__Vector_impl_data._M_start + uVar5);
      uVar5 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
      uVar1 = ((long)(ds->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(ds->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7;
    } while (uVar5 <= uVar1 && uVar1 - uVar5 != 0);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return poVar2;
}

Assistant:

ostream& operator<<(ostream& os, const vector<Dim>& ds) {
  os << '[';
  for (unsigned i = 0; i < ds.size(); ++i)
    os << (i ? " " : "") << ds[i];
  return os << ']';
}